

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldGamma
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double multFact)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Wvalue WVar6;
  double local_e0;
  YieldResult result;
  double Ly;
  double Qy;
  double m8;
  double Nq;
  double m7;
  double densCorr;
  double m5;
  double m2;
  double m1;
  double m6;
  double m4;
  double m3;
  double alpha;
  double Wq_eV;
  Wvalue wvalue;
  double multFact_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  dVar2 = VDetector::get_molarMass(this->fdetector);
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  WVar6 = WorkFunction(density,dVar2,bVar1);
  Wq_eV = WVar6.Wq_eV;
  dVar2 = pow(dfield / 165.34,0.72665);
  dVar2 = -30.622600000000002 / (dVar2 + 1.0) + 33.951;
  dVar3 = pow(dfield / 34.195,0.87459);
  dVar3 = -12.418999999999999 / (dVar3 + 1.0) + 23.156;
  dVar4 = pow(density,8.2076);
  dVar4 = pow(dfield / (240720.0 / dVar4),0.83344);
  Qy = 2.0;
  bVar1 = VDetector::get_inGas(this->fdetector);
  if (bVar1) {
    Qy = -2.0;
  }
  dVar5 = pow(energy / 2.0,2.0);
  dVar4 = pow(energy / (762.425 / (dVar4 + 1.0) + 66.825),Qy);
  Ly = dVar2 + (1000.0 / Wq_eV - dVar2) / (dVar5 + 1.0) + dVar3 + (0.0 - dVar3) / (dVar4 + 1.0);
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  if (!bVar1) {
    Ly = Ly * 1.08;
  }
  result.DeltaT_Scint = ((energy * 1000.0) / Wq_eV) / energy - multFact * Ly;
  memset(&local_e0,0,0x30);
  local_e0 = result.DeltaT_Scint * energy;
  result.PhotonYield = multFact * Ly * energy;
  (*this->_vptr_NESTcalc[0x11])(energy,density);
  result.ExcitonRatio = 1.0;
  result.ElectricField = -999.0;
  result.Lindhard = dfield;
  (*this->_vptr_NESTcalc[0xb])(energy,Wq_eV,__return_storage_ptr__,this,&local_e0);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldGamma(double energy, double density,
                                    double dfield, double multFact) {
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;
  constexpr double m3 = 2., m4 = 2., m6 = 0.;

  const double m1 =
      33.951 + (3.3284 - 33.951) / (1. + pow(dfield / 165.34, .72665));
  double m2 = 1000 / Wq_eV;
  double m5 = 23.156 + (10.737 - 23.156) / (1. + pow(dfield / 34.195, .87459));
  double densCorr = 240720. / pow(density, 8.2076);
  double m7 =
      66.825 + (829.25 - 66.825) / (1. + pow(dfield / densCorr, .83344));

  double Nq = energy * 1000. / Wq_eV;
  double m8 = 2.;
  if (fdetector->get_inGas()) m8 = -2.;
  double Qy = m1 + (m2 - m1) / (1. + pow(energy / m3, m4)) + m5 +
              (m6 - m5) / (1. + pow(energy / m7, m8));
  if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  Qy *= multFact;
  double Ly = Nq / energy - Qy;

  YieldResult result{};
  result.PhotonYield = Ly * energy;
  result.ElectronYield = Qy * energy;
  result.ExcitonRatio = NexONi(energy, density);
  result.Lindhard = 1;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(result, energy, Wq_eV);
}